

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall
slang::SmallVectorBase<slang::ast::BlockEventListControl::Event>::copy
          (SmallVectorBase<slang::ast::BlockEventListControl::Event> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  size_type sVar4;
  undefined8 uVar5;
  Event *first;
  long lVar6;
  int local_18 [4];
  
  if (this->len != 0) {
    first = (Event *)BumpAllocator::allocate((BumpAllocator *)dst,this->len << 4,8);
    pEVar3 = this->data_;
    sVar4 = this->len;
    for (lVar6 = 0; sVar4 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      puVar1 = (undefined8 *)((long)&pEVar3->target + lVar6);
      puVar2 = (undefined8 *)((long)&first->target + lVar6);
      uVar5 = puVar1[1];
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
    }
    nonstd::span_lite::span<slang::ast::BlockEventListControl::Event,18446744073709551615ul>::
    span<slang::ast::BlockEventListControl::Event*>
              ((span<slang::ast::BlockEventListControl::Event,18446744073709551615ul> *)local_18,
               first,this->len);
    return local_18[0];
  }
  return 0;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }